

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O2

sexp_conflict
sexp_bytevector_s16_native_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2)

{
  sexp psVar1;
  sexp_conflict psVar2;
  short sVar3;
  
  if ((((ulong)arg0 & 3) != 0) || (arg0->tag != 8)) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar2;
  }
  if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
    return psVar2;
  }
  if ((((ulong)arg2 & 1) == 0) && ((((ulong)arg2 & 2) != 0 || (arg2->tag != 0xc)))) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
    return psVar2;
  }
  if (((ulong)arg1 & 1) != 0) {
    if (((long)arg1 < 0) || (psVar1 = (sexp)((long)arg1 >> 1), (arg0->value).type.name <= psVar1))
    goto LAB_00103f5d;
    goto LAB_00103f7c;
  }
  if (((ulong)arg1 & 2) == 0) {
    if (arg1->tag == 0xc) {
      if ((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length < 0) goto LAB_00103f5d;
      if (arg1->tag != 0xc) goto LAB_00103f3d;
      psVar1 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
    }
    else {
LAB_00103f3d:
      psVar1 = (sexp)0x0;
    }
    if ((arg0->value).type.name <= psVar1) {
LAB_00103f5d:
      psVar2 = (sexp_conflict)
               sexp_user_exception_ls
                         (ctx,self,"assertion failed: (< -1 arg1 (bytevector-length arg0))",2,
                          (char)arg1,(arg0->value).stack.length * 2 + 1);
      return psVar2;
    }
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      psVar1 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
      goto LAB_00103f7c;
    }
  }
  else if ((arg0->value).type.name == (sexp)0x0) goto LAB_00103f5d;
  psVar1 = (sexp)0x0;
LAB_00103f7c:
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
      sVar3 = (short)(arg2->value).flonum_bits[0] * (short)(arg2->value).uvector.length;
    }
    else {
      sVar3 = 0;
    }
  }
  else {
    sVar3 = (short)((long)arg2 >> 1);
  }
  *(short *)((long)&arg0->value + (long)(int)psVar1 + 8) = sVar3;
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_bytevector_s16_native_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_bytesp(arg0))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (!((-1 < sexp_sint_value(arg1)) && (sexp_sint_value(arg1) < sexp_bytes_length(arg0)))) {
    return sexp_user_exception_ls(ctx, self, "assertion failed: " "(< -1 arg1 (bytevector-length arg0))", 2, arg1, sexp_make_fixnum(sexp_bytes_length(arg0)));
  }
  res = ((bytevector_s16_native_set_x(sexp_bytes_data(arg0), sexp_sint_value(arg1), sexp_sint_value(arg2))), SEXP_VOID);
  return res;
}